

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_decompress.c
# Opt level: O3

int decode_existing_symbol(byte_t *input_buffer)

{
  long lVar1;
  uint uVar2;
  adh_node_t *node;
  char *pcVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  byte_t sub_buffer [32];
  bit_array_t bit_array;
  byte_t local_158 [46];
  bit_array_t local_12a;
  
  lVar1 = in_bit_idx;
  memset(&local_12a,0,0x102);
  local_158[0x10] = '\0';
  local_158[0x11] = '\0';
  local_158[0x12] = '\0';
  local_158[0x13] = '\0';
  local_158[0x14] = '\0';
  local_158[0x15] = '\0';
  local_158[0x16] = '\0';
  local_158[0x17] = '\0';
  local_158[0x18] = '\0';
  local_158[0x19] = '\0';
  local_158[0x1a] = '\0';
  local_158[0x1b] = '\0';
  local_158[0x1c] = '\0';
  local_158[0x1d] = '\0';
  local_158[0x1e] = '\0';
  local_158[0x1f] = '\0';
  local_158[0] = '\0';
  local_158[1] = '\0';
  local_158[2] = '\0';
  local_158[3] = '\0';
  local_158[4] = '\0';
  local_158[5] = '\0';
  local_158[6] = '\0';
  local_158[7] = '\0';
  local_158[8] = '\0';
  local_158[9] = '\0';
  local_158[10] = '\0';
  local_158[0xb] = '\0';
  local_158[0xc] = '\0';
  local_158[0xd] = '\0';
  local_158[0xe] = '\0';
  local_158[0xf] = '\0';
  lVar6 = last_bit_idx - lVar1;
  if (0xfe < lVar6) {
    lVar6 = 0xff;
  }
  uVar2 = read_data_cross_bytes(input_buffer,(int)lVar6 + 1,local_158);
  if (0 < (int)uVar2) {
    uVar7 = 0;
    do {
      uVar5 = 0;
      do {
        uVar4 = (ulong)local_12a.length;
        if (0x100 < uVar4) {
          log_error("decode_existing_symbol","bit_array_size (%d) >= MAX_CODE_BITS (%d)",uVar4,0x100
                   );
          return 1;
        }
        if (uVar4 != 0) {
          uVar4 = uVar4 + 1;
          do {
            local_12a.buffer[uVar4 - 1] = local_12a.buffer[uVar4 - 2];
            uVar4 = uVar4 - 1;
          } while (1 < uVar4);
        }
        local_12a.buffer[0] = bit_check(local_158[uVar7],7 - uVar5);
        local_12a.length = local_12a.length + 1;
        node = adh_search_leaf_by_encoding(&local_12a);
      } while ((uVar5 < 7) && (uVar5 = uVar5 + 1, node == (adh_node_t *)0x0));
      uVar7 = uVar7 + 1;
    } while ((uVar7 < uVar2) && (node == (adh_node_t *)0x0));
    if (node != (adh_node_t *)0x0) {
      in_bit_idx = lVar1 + (ulong)local_12a.length;
      output_buffer[output_byte_idx] = (byte_t)node->symbol;
      output_byte_idx = output_byte_idx + 1;
      adh_update_tree(node,false);
      return 0;
    }
  }
  lVar6 = in_bit_idx;
  lVar1 = last_bit_idx;
  pcVar3 = fmt_bit_array(&local_12a);
  log_error("decode_existing_symbol","cannot find node: in_bit_idx=%u last_bit_idx=%u bin=%s\n",
            lVar6,lVar1,pcVar3);
  return 1;
}

Assistant:

int decode_existing_symbol(const byte_t input_buffer[]) {
    long original_input_buffer_bit_idx = in_bit_idx;

    adh_node_t* node = NULL;
    bit_array_t bit_array = {0};
    byte_t  sub_buffer[MAX_CODE_BYTES] = {0};
    long missing = last_bit_idx - in_bit_idx + 1;

#ifdef _DEBUG
    log_debug("decode_existing_symbol", "in_bit_idx=%-8u last_bit_idx=%u missing=%d\n",
              in_bit_idx, last_bit_idx, missing);
#endif

    int max_bits = MAX_CODE_BITS < missing ? MAX_CODE_BITS : missing;
    int num_bytes = read_data_cross_bytes(input_buffer, max_bits, sub_buffer);

    for (int byte_idx = 0; byte_idx < num_bytes && node == NULL; ++byte_idx) {
        for (int bit_idx = 0; bit_idx < SYMBOL_BITS && node == NULL; ++bit_idx) {
            if(bit_array.length > MAX_CODE_BITS) {
                log_error("decode_existing_symbol", "bit_array_size (%d) >= MAX_CODE_BITS (%d)", bit_array.length, MAX_CODE_BITS);
                return RC_FAIL;
            }

            // shift left previous bits
            for (int i = bit_array.length; i > 0; --i) {
                bit_array.buffer[i] = bit_array.buffer[i-1];
            }

            bit_array.buffer[0] = bit_check(sub_buffer[byte_idx], SYMBOL_BITS - bit_idx -1);
            bit_array.length++;
            node = adh_search_leaf_by_encoding(&bit_array);
        }
    }

    if(node == NULL) {
        log_error("decode_existing_symbol", "cannot find node: in_bit_idx=%u last_bit_idx=%u bin=%s\n",
                in_bit_idx, last_bit_idx, fmt_bit_array(&bit_array) );
        return RC_FAIL;
    }

#ifdef _DEBUG
    log_debug("decode_existing_symbol", "%s bin=%s\n", fmt_symbol(node->symbol), fmt_bit_array(&bit_array));
#endif

    in_bit_idx = original_input_buffer_bit_idx + bit_array.length;
    output_symbol((byte_t)node->symbol);
    adh_update_tree(node, false);
    return RC_OK;
}